

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

void vrna_exp_params_rescale(vrna_fold_compound_t *vc,double *mfe)

{
  int iVar1;
  vrna_exp_param_t *pvVar2;
  double dVar3;
  vrna_md_t *md;
  double kT;
  double e_per_nt;
  vrna_exp_param_t *pf;
  double *mfe_local;
  vrna_fold_compound_t *vc_local;
  
  if (vc != (vrna_fold_compound_t *)0x0) {
    if (vc->exp_params == (vrna_exp_param_t *)0x0) {
      if (vc->type == VRNA_FC_TYPE_SINGLE) {
        pvVar2 = vrna_exp_params(&vc->params->model_details);
        vc->exp_params = pvVar2;
      }
      else if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
        pvVar2 = vrna_exp_params_comparative
                           ((vc->field_23).field_1.n_seq,&vc->params->model_details);
        vc->exp_params = pvVar2;
      }
    }
    else {
      iVar1 = memcmp(&vc->params->model_details,&vc->exp_params->model_details,0x7e8);
      if (iVar1 != 0) {
        vrna_md_copy(&vc->exp_params->model_details,&vc->params->model_details);
      }
    }
    pvVar2 = vc->exp_params;
    if (pvVar2 != (vrna_exp_param_t *)0x0) {
      md = (vrna_md_t *)pvVar2->kT;
      if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
        md = (vrna_md_t *)((double)md / (double)(vc->field_23).field_1.n_seq);
      }
      if ((mfe != (double *)0x0) || (pvVar2->pf_scale <= 1.0 && pvVar2->pf_scale != 1.0)) {
        if (mfe == (double *)0x0) {
          kT = (pvVar2->temperature - 37.0) * 7.27 + -185.0;
        }
        else {
          kT = (*mfe * 1000.0) / (double)vc->length;
        }
        dVar3 = exp(-((pvVar2->model_details).sfact * kT) / (double)md);
        pvVar2->pf_scale = dVar3;
      }
      if (pvVar2->pf_scale <= 1.0 && pvVar2->pf_scale != 1.0) {
        pvVar2->pf_scale = 1.0;
      }
      rescale_params(vc);
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_exp_params_rescale(vrna_fold_compound_t  *vc,
                        double                *mfe)
{
  vrna_exp_param_t  *pf;
  double            e_per_nt, kT;
  vrna_md_t         *md;

  if (vc) {
    if (!vc->exp_params) {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:
          vc->exp_params = vrna_exp_params(&(vc->params->model_details));
          break;
        case VRNA_FC_TYPE_COMPARATIVE:
          vc->exp_params = vrna_exp_params_comparative(vc->n_seq, &(vc->params->model_details));
          break;
      }
    } else if (memcmp(&(vc->params->model_details),
                      &(vc->exp_params->model_details),
                      sizeof(vrna_md_t)) != 0) {
      /* make sure that model details are matching */
      (void)vrna_md_copy(&(vc->exp_params->model_details), &(vc->params->model_details));
      /* we probably need some mechanism to check whether DP matrices still match the new model settings! */
    }

    pf = vc->exp_params;
    if (pf) {
      kT  = pf->kT;
      md  = &(pf->model_details);

      if (vc->type == VRNA_FC_TYPE_COMPARATIVE)
        kT /= vc->n_seq;

      /* re-compute scaling factor if necessary */
      if ((mfe) || (pf->pf_scale < 1.)) {
        if (mfe)  /* use largest known Boltzmann factor for scaling */
          e_per_nt = *mfe * 1000. / vc->length;
        else      /* use mean energy for random sequences: 184.3*length cal for scaling */
          e_per_nt = -185 + (pf->temperature - 37.) * 7.27;

        /* apply user-defined scaling factor to allow scaling for unusually stable/unstable structure enembles */
        pf->pf_scale = exp(-(md->sfact * e_per_nt) / kT);
      }

      if (pf->pf_scale < 1.)
        pf->pf_scale = 1.;

      rescale_params(vc);
    }
  }
}